

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O1

int Quantize2Blocks_SSE2(int16_t *in,int16_t *out,VP8Matrix *mtx)

{
  int16_t iVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  unkbyte10 Var20;
  unkbyte10 Var21;
  int iVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar28;
  short sVar29;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  undefined1 auVar30 [16];
  short sVar44;
  short sVar45;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  undefined1 auVar46 [16];
  short sVar53;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar75;
  short sVar80;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [12];
  short sVar86;
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int iVar87;
  short sVar95;
  undefined1 auVar89 [12];
  short sVar94;
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar76 [12];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined1 auVar88 [12];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  
  auVar25 = _DAT_0014bdb0;
  auVar24 = *(undefined1 (*) [16])in;
  auVar67 = *(undefined1 (*) [16])(in + 8);
  auVar58 = *(undefined1 (*) [16])mtx->iq_;
  auVar72 = *(undefined1 (*) [16])(mtx->iq_ + 8);
  sVar28 = auVar24._0_2_;
  sVar86 = -sVar28;
  sVar31 = auVar24._2_2_;
  sVar94 = -sVar31;
  sVar33 = auVar24._4_2_;
  sVar61 = -sVar33;
  sVar35 = auVar24._6_2_;
  sVar62 = -sVar35;
  sVar37 = auVar24._8_2_;
  sVar63 = -sVar37;
  sVar39 = auVar24._10_2_;
  sVar64 = -sVar39;
  sVar41 = auVar24._12_2_;
  sVar65 = -sVar41;
  sVar43 = auVar24._14_2_;
  sVar66 = -sVar43;
  auVar30 = psraw(auVar24,0xf);
  sVar29 = auVar67._0_2_;
  sVar80 = -sVar29;
  sVar32 = auVar67._2_2_;
  sVar95 = -sVar32;
  sVar34 = auVar67._4_2_;
  sVar2 = -sVar34;
  sVar36 = auVar67._6_2_;
  sVar3 = -sVar36;
  sVar38 = auVar67._8_2_;
  sVar4 = -sVar38;
  sVar40 = auVar67._10_2_;
  sVar5 = -sVar40;
  sVar42 = auVar67._12_2_;
  sVar6 = -sVar42;
  sVar44 = auVar67._14_2_;
  sVar7 = -sVar44;
  auVar46 = psraw(auVar67,0xf);
  auVar82._0_2_ =
       mtx->sharpen_[0] + ((ushort)(sVar86 < sVar28) * sVar28 | (ushort)(sVar86 >= sVar28) * sVar86)
  ;
  auVar82._2_2_ =
       mtx->sharpen_[1] + ((ushort)(sVar94 < sVar31) * sVar31 | (ushort)(sVar94 >= sVar31) * sVar94)
  ;
  auVar82._4_2_ =
       mtx->sharpen_[2] + ((ushort)(sVar61 < sVar33) * sVar33 | (ushort)(sVar61 >= sVar33) * sVar61)
  ;
  auVar82._6_2_ =
       mtx->sharpen_[3] + ((ushort)(sVar62 < sVar35) * sVar35 | (ushort)(sVar62 >= sVar35) * sVar62)
  ;
  auVar82._8_2_ =
       mtx->sharpen_[4] + ((ushort)(sVar63 < sVar37) * sVar37 | (ushort)(sVar63 >= sVar37) * sVar63)
  ;
  auVar82._10_2_ =
       mtx->sharpen_[5] + ((ushort)(sVar64 < sVar39) * sVar39 | (ushort)(sVar64 >= sVar39) * sVar64)
  ;
  auVar82._12_2_ =
       mtx->sharpen_[6] + ((ushort)(sVar65 < sVar41) * sVar41 | (ushort)(sVar65 >= sVar41) * sVar65)
  ;
  auVar82._14_2_ =
       mtx->sharpen_[7] + ((ushort)(sVar66 < sVar43) * sVar43 | (ushort)(sVar66 >= sVar43) * sVar66)
  ;
  auVar90._0_2_ =
       mtx->sharpen_[8] + ((ushort)(sVar80 < sVar29) * sVar29 | (ushort)(sVar80 >= sVar29) * sVar80)
  ;
  auVar90._2_2_ =
       mtx->sharpen_[9] + ((ushort)(sVar95 < sVar32) * sVar32 | (ushort)(sVar95 >= sVar32) * sVar95)
  ;
  auVar90._4_2_ =
       mtx->sharpen_[10] + ((ushort)(sVar2 < sVar34) * sVar34 | (ushort)(sVar2 >= sVar34) * sVar2);
  auVar90._6_2_ =
       mtx->sharpen_[0xb] + ((ushort)(sVar3 < sVar36) * sVar36 | (ushort)(sVar3 >= sVar36) * sVar3);
  auVar90._8_2_ =
       mtx->sharpen_[0xc] + ((ushort)(sVar4 < sVar38) * sVar38 | (ushort)(sVar4 >= sVar38) * sVar4);
  auVar90._10_2_ =
       mtx->sharpen_[0xd] + ((ushort)(sVar5 < sVar40) * sVar40 | (ushort)(sVar5 >= sVar40) * sVar5);
  auVar90._12_2_ =
       mtx->sharpen_[0xe] + ((ushort)(sVar6 < sVar42) * sVar42 | (ushort)(sVar6 >= sVar42) * sVar6);
  auVar90._14_2_ =
       mtx->sharpen_[0xf] + ((ushort)(sVar7 < sVar44) * sVar44 | (ushort)(sVar7 >= sVar44) * sVar7);
  auVar67 = pmulhuw(auVar82,auVar58);
  sVar86 = auVar82._6_2_ * auVar58._6_2_;
  auVar24 = pmulhuw(auVar90,auVar72);
  sVar94 = auVar90._6_2_ * auVar72._6_2_;
  iVar22 = CONCAT22(auVar67._6_2_,sVar86);
  Var20 = CONCAT64(CONCAT42(iVar22,auVar67._4_2_),CONCAT22(auVar82._4_2_ * auVar58._4_2_,sVar86));
  auVar16._4_8_ = (long)((unkuint10)Var20 >> 0x10);
  auVar16._2_2_ = auVar67._2_2_;
  auVar16._0_2_ = auVar82._2_2_ * auVar58._2_2_;
  iVar75 = CONCAT22(auVar67._8_2_,auVar82._8_2_ * auVar58._8_2_);
  auVar81._0_8_ = CONCAT26(auVar67._10_2_,CONCAT24(auVar82._10_2_ * auVar58._10_2_,iVar75));
  auVar81._8_2_ = auVar82._12_2_ * auVar58._12_2_;
  auVar81._10_2_ = auVar67._12_2_;
  auVar83._12_2_ = auVar82._14_2_ * auVar58._14_2_;
  auVar83._0_12_ = auVar81;
  auVar83._14_2_ = auVar67._14_2_;
  iVar23 = CONCAT22(auVar24._6_2_,sVar94);
  Var21 = CONCAT64(CONCAT42(iVar23,auVar24._4_2_),CONCAT22(auVar90._4_2_ * auVar72._4_2_,sVar94));
  auVar17._4_8_ = (long)((unkuint10)Var21 >> 0x10);
  auVar17._2_2_ = auVar24._2_2_;
  auVar17._0_2_ = auVar90._2_2_ * auVar72._2_2_;
  iVar87 = CONCAT22(auVar24._8_2_,auVar90._8_2_ * auVar72._8_2_);
  auVar88._0_8_ = CONCAT26(auVar24._10_2_,CONCAT24(auVar90._10_2_ * auVar72._10_2_,iVar87));
  auVar88._8_2_ = auVar90._12_2_ * auVar72._12_2_;
  auVar88._10_2_ = auVar24._12_2_;
  auVar91._12_2_ = auVar90._14_2_ * auVar72._14_2_;
  auVar91._0_12_ = auVar88;
  auVar91._14_2_ = auVar24._14_2_;
  auVar54._0_4_ =
       (int)(mtx->bias_[0] + CONCAT22(auVar67._0_2_,auVar82._0_2_ * auVar58._0_2_)) >> 0x11;
  auVar54._4_4_ = (int)(mtx->bias_[1] + auVar16._0_4_) >> 0x11;
  auVar54._8_4_ = (int)(mtx->bias_[2] + (int)((unkuint10)Var20 >> 0x10)) >> 0x11;
  auVar54._12_4_ = (int)(mtx->bias_[3] + iVar22) >> 0x11;
  auVar67._0_4_ = (int)(mtx->bias_[4] + iVar75) >> 0x11;
  auVar67._4_4_ = (int)(mtx->bias_[5] + (int)((ulong)auVar81._0_8_ >> 0x20)) >> 0x11;
  auVar67._8_4_ = (int)(mtx->bias_[6] + auVar81._8_4_) >> 0x11;
  auVar67._12_4_ = (int)(mtx->bias_[7] + auVar83._12_4_) >> 0x11;
  auVar67 = packssdw(auVar54,auVar67);
  auVar68._0_4_ =
       (int)(mtx->bias_[8] + CONCAT22(auVar24._0_2_,auVar90._0_2_ * auVar72._0_2_)) >> 0x11;
  auVar68._4_4_ = (int)(mtx->bias_[9] + auVar17._0_4_) >> 0x11;
  auVar68._8_4_ = (int)(mtx->bias_[10] + (int)((unkuint10)Var21 >> 0x10)) >> 0x11;
  auVar68._12_4_ = (int)(mtx->bias_[0xb] + iVar23) >> 0x11;
  auVar77._0_4_ = (int)(mtx->bias_[0xc] + iVar87) >> 0x11;
  auVar77._4_4_ = (int)(mtx->bias_[0xd] + (int)((ulong)auVar88._0_8_ >> 0x20)) >> 0x11;
  auVar77._8_4_ = (int)(mtx->bias_[0xe] + auVar88._8_4_) >> 0x11;
  auVar77._12_4_ = (int)(mtx->bias_[0xf] + auVar91._12_4_) >> 0x11;
  auVar24 = packssdw(auVar68,auVar77);
  sVar86 = (short)DAT_0014bdb0;
  sVar94 = auVar67._0_2_;
  auVar55._0_2_ = (ushort)(sVar86 < sVar94) * sVar86 | (ushort)(sVar86 >= sVar94) * sVar94;
  sVar94 = DAT_0014bdb0._2_2_;
  sVar61 = auVar67._2_2_;
  auVar55._2_2_ = (ushort)(sVar94 < sVar61) * sVar94 | (ushort)(sVar94 >= sVar61) * sVar61;
  sVar61 = DAT_0014bdb0._4_2_;
  sVar62 = auVar67._4_2_;
  auVar55._4_2_ = (ushort)(sVar61 < sVar62) * sVar61 | (ushort)(sVar61 >= sVar62) * sVar62;
  sVar62 = DAT_0014bdb0._6_2_;
  sVar63 = auVar67._6_2_;
  auVar55._6_2_ = (ushort)(sVar62 < sVar63) * sVar62 | (ushort)(sVar62 >= sVar63) * sVar63;
  sVar63 = DAT_0014bdb0._8_2_;
  sVar64 = auVar67._8_2_;
  auVar55._8_2_ = (ushort)(sVar63 < sVar64) * sVar63 | (ushort)(sVar63 >= sVar64) * sVar64;
  sVar64 = DAT_0014bdb0._10_2_;
  sVar65 = auVar67._10_2_;
  auVar55._10_2_ = (ushort)(sVar64 < sVar65) * sVar64 | (ushort)(sVar64 >= sVar65) * sVar65;
  sVar65 = DAT_0014bdb0._12_2_;
  sVar66 = auVar67._12_2_;
  sVar80 = auVar67._14_2_;
  auVar55._12_2_ = (ushort)(sVar65 < sVar66) * sVar65 | (ushort)(sVar65 >= sVar66) * sVar66;
  sVar66 = DAT_0014bdb0._14_2_;
  auVar55._14_2_ = (ushort)(sVar66 < sVar80) * sVar66 | (ushort)(sVar66 >= sVar80) * sVar80;
  sVar80 = auVar24._0_2_;
  auVar69._0_2_ = (ushort)(sVar86 < sVar80) * sVar86 | (ushort)(sVar86 >= sVar80) * sVar80;
  sVar80 = auVar24._2_2_;
  auVar69._2_2_ = (ushort)(sVar94 < sVar80) * sVar94 | (ushort)(sVar94 >= sVar80) * sVar80;
  sVar80 = auVar24._4_2_;
  auVar69._4_2_ = (ushort)(sVar61 < sVar80) * sVar61 | (ushort)(sVar61 >= sVar80) * sVar80;
  sVar80 = auVar24._6_2_;
  auVar69._6_2_ = (ushort)(sVar62 < sVar80) * sVar62 | (ushort)(sVar62 >= sVar80) * sVar80;
  sVar80 = auVar24._8_2_;
  auVar69._8_2_ = (ushort)(sVar63 < sVar80) * sVar63 | (ushort)(sVar63 >= sVar80) * sVar80;
  sVar80 = auVar24._10_2_;
  auVar69._10_2_ = (ushort)(sVar64 < sVar80) * sVar64 | (ushort)(sVar64 >= sVar80) * sVar80;
  sVar80 = auVar24._12_2_;
  sVar95 = auVar24._14_2_;
  auVar69._12_2_ = (ushort)(sVar65 < sVar80) * sVar65 | (ushort)(sVar65 >= sVar80) * sVar80;
  auVar69._14_2_ = (ushort)(sVar66 < sVar95) * sVar66 | (ushort)(sVar66 >= sVar95) * sVar95;
  auVar55 = auVar55 ^ auVar30;
  auVar69 = auVar69 ^ auVar46;
  auVar56._0_2_ = auVar55._0_2_ - auVar30._0_2_;
  auVar56._2_2_ = auVar55._2_2_ - auVar30._2_2_;
  auVar56._4_2_ = auVar55._4_2_ - auVar30._4_2_;
  auVar56._6_2_ = auVar55._6_2_ - auVar30._6_2_;
  auVar56._8_2_ = auVar55._8_2_ - auVar30._8_2_;
  auVar56._10_2_ = auVar55._10_2_ - auVar30._10_2_;
  auVar56._12_2_ = auVar55._12_2_ - auVar30._12_2_;
  auVar56._14_2_ = auVar55._14_2_ - auVar30._14_2_;
  auVar70._0_2_ = auVar69._0_2_ - auVar46._0_2_;
  auVar70._2_2_ = auVar69._2_2_ - auVar46._2_2_;
  auVar70._4_2_ = auVar69._4_2_ - auVar46._4_2_;
  auVar70._6_2_ = auVar69._6_2_ - auVar46._6_2_;
  auVar70._8_2_ = auVar69._8_2_ - auVar46._8_2_;
  auVar70._10_2_ = auVar69._10_2_ - auVar46._10_2_;
  auVar70._12_2_ = auVar69._12_2_ - auVar46._12_2_;
  auVar70._14_2_ = auVar69._14_2_ - auVar46._14_2_;
  auVar24._0_2_ = mtx->q_[0] * auVar56._0_2_;
  auVar24._2_2_ = mtx->q_[1] * auVar56._2_2_;
  auVar24._4_2_ = mtx->q_[2] * auVar56._4_2_;
  auVar24._6_2_ = mtx->q_[3] * auVar56._6_2_;
  auVar24._8_2_ = mtx->q_[4] * auVar56._8_2_;
  auVar24._10_2_ = mtx->q_[5] * auVar56._10_2_;
  auVar24._12_2_ = mtx->q_[6] * auVar56._12_2_;
  auVar24._14_2_ = mtx->q_[7] * auVar56._14_2_;
  auVar26._0_2_ = mtx->q_[8] * auVar70._0_2_;
  auVar26._2_2_ = mtx->q_[9] * auVar70._2_2_;
  auVar26._4_2_ = mtx->q_[10] * auVar70._4_2_;
  auVar26._6_2_ = mtx->q_[0xb] * auVar70._6_2_;
  auVar26._8_2_ = mtx->q_[0xc] * auVar70._8_2_;
  auVar26._10_2_ = mtx->q_[0xd] * auVar70._10_2_;
  auVar26._12_2_ = mtx->q_[0xe] * auVar70._12_2_;
  auVar26._14_2_ = mtx->q_[0xf] * auVar70._14_2_;
  *(undefined1 (*) [16])in = auVar24;
  *(undefined1 (*) [16])(in + 8) = auVar26;
  auVar24 = pshufhw(auVar24,auVar56,0xc6);
  auVar30._0_4_ = auVar24._0_4_;
  auVar30._8_4_ = auVar24._8_4_;
  auVar30._4_4_ = auVar24._12_4_;
  auVar30._12_4_ = auVar24._4_4_;
  auVar24 = pshufhw(auVar30,auVar30,0x39);
  auVar67 = pshuflw(auVar26,auVar70,0xc6);
  auVar27._0_4_ = auVar67._0_4_;
  auVar27._12_4_ = auVar67._12_4_;
  auVar27._4_4_ = auVar67._8_4_;
  auVar27._8_4_ = auVar67._4_4_;
  auVar67 = pshuflw(auVar27,auVar27,0x39);
  *(undefined1 (*) [16])out = auVar24;
  *(undefined1 (*) [16])(out + 8) = auVar67;
  auVar24 = packsswb(auVar24,auVar67);
  iVar1 = out[3];
  out[3] = out[0xc];
  out[0xc] = iVar1;
  auVar46[0] = -(auVar24[0] == '\0');
  auVar46[1] = -(auVar24[1] == '\0');
  auVar46[2] = -(auVar24[2] == '\0');
  auVar46[3] = -(auVar24[3] == '\0');
  auVar46[4] = -(auVar24[4] == '\0');
  auVar46[5] = -(auVar24[5] == '\0');
  auVar46[6] = -(auVar24[6] == '\0');
  auVar46[7] = -(auVar24[7] == '\0');
  auVar46[8] = -(auVar24[8] == '\0');
  auVar46[9] = -(auVar24[9] == '\0');
  auVar46[10] = -(auVar24[10] == '\0');
  auVar46[0xb] = -(auVar24[0xb] == '\0');
  auVar46[0xc] = -(auVar24[0xc] == '\0');
  auVar46[0xd] = -(auVar24[0xd] == '\0');
  auVar46[0xe] = -(auVar24[0xe] == '\0');
  auVar46[0xf] = -(auVar24[0xf] == '\0');
  auVar24 = *(undefined1 (*) [16])(in + 0x10);
  auVar67 = *(undefined1 (*) [16])(in + 0x18);
  uVar8 = mtx->q_[8];
  uVar9 = mtx->q_[9];
  uVar10 = mtx->q_[10];
  uVar11 = mtx->q_[0xb];
  uVar12 = mtx->q_[0xc];
  uVar13 = mtx->q_[0xd];
  uVar14 = mtx->q_[0xe];
  uVar15 = mtx->q_[0xf];
  auVar58 = *(undefined1 (*) [16])mtx->iq_;
  auVar72 = *(undefined1 (*) [16])(mtx->iq_ + 8);
  sVar29 = auVar24._0_2_;
  sVar80 = -sVar29;
  sVar32 = auVar24._2_2_;
  sVar95 = -sVar32;
  sVar34 = auVar24._4_2_;
  sVar2 = -sVar34;
  sVar36 = auVar24._6_2_;
  sVar3 = -sVar36;
  sVar38 = auVar24._8_2_;
  sVar4 = -sVar38;
  sVar40 = auVar24._10_2_;
  sVar5 = -sVar40;
  sVar42 = auVar24._12_2_;
  sVar6 = -sVar42;
  sVar44 = auVar24._14_2_;
  sVar7 = -sVar44;
  auVar24 = psraw(auVar24,0xf);
  sVar45 = auVar67._0_2_;
  sVar28 = -sVar45;
  sVar47 = auVar67._2_2_;
  sVar31 = -sVar47;
  sVar48 = auVar67._4_2_;
  sVar33 = -sVar48;
  sVar49 = auVar67._6_2_;
  sVar35 = -sVar49;
  sVar50 = auVar67._8_2_;
  sVar37 = -sVar50;
  sVar51 = auVar67._10_2_;
  sVar39 = -sVar51;
  sVar52 = auVar67._12_2_;
  sVar41 = -sVar52;
  sVar53 = auVar67._14_2_;
  sVar43 = -sVar53;
  auVar67 = psraw(auVar67,0xf);
  auVar92._0_2_ =
       mtx->sharpen_[0] + ((ushort)(sVar80 < sVar29) * sVar29 | (ushort)(sVar80 >= sVar29) * sVar80)
  ;
  auVar92._2_2_ =
       mtx->sharpen_[1] + ((ushort)(sVar95 < sVar32) * sVar32 | (ushort)(sVar95 >= sVar32) * sVar95)
  ;
  auVar92._4_2_ =
       mtx->sharpen_[2] + ((ushort)(sVar2 < sVar34) * sVar34 | (ushort)(sVar2 >= sVar34) * sVar2);
  auVar92._6_2_ =
       mtx->sharpen_[3] + ((ushort)(sVar3 < sVar36) * sVar36 | (ushort)(sVar3 >= sVar36) * sVar3);
  auVar92._8_2_ =
       mtx->sharpen_[4] + ((ushort)(sVar4 < sVar38) * sVar38 | (ushort)(sVar4 >= sVar38) * sVar4);
  auVar92._10_2_ =
       mtx->sharpen_[5] + ((ushort)(sVar5 < sVar40) * sVar40 | (ushort)(sVar5 >= sVar40) * sVar5);
  auVar92._12_2_ =
       mtx->sharpen_[6] + ((ushort)(sVar6 < sVar42) * sVar42 | (ushort)(sVar6 >= sVar42) * sVar6);
  auVar92._14_2_ =
       mtx->sharpen_[7] + ((ushort)(sVar7 < sVar44) * sVar44 | (ushort)(sVar7 >= sVar44) * sVar7);
  auVar78._0_2_ =
       mtx->sharpen_[8] + ((ushort)(sVar28 < sVar45) * sVar45 | (ushort)(sVar28 >= sVar45) * sVar28)
  ;
  auVar78._2_2_ =
       mtx->sharpen_[9] + ((ushort)(sVar31 < sVar47) * sVar47 | (ushort)(sVar31 >= sVar47) * sVar31)
  ;
  auVar78._4_2_ =
       mtx->sharpen_[10] +
       ((ushort)(sVar33 < sVar48) * sVar48 | (ushort)(sVar33 >= sVar48) * sVar33);
  auVar78._6_2_ =
       mtx->sharpen_[0xb] +
       ((ushort)(sVar35 < sVar49) * sVar49 | (ushort)(sVar35 >= sVar49) * sVar35);
  auVar78._8_2_ =
       mtx->sharpen_[0xc] +
       ((ushort)(sVar37 < sVar50) * sVar50 | (ushort)(sVar37 >= sVar50) * sVar37);
  auVar78._10_2_ =
       mtx->sharpen_[0xd] +
       ((ushort)(sVar39 < sVar51) * sVar51 | (ushort)(sVar39 >= sVar51) * sVar39);
  auVar78._12_2_ =
       mtx->sharpen_[0xe] +
       ((ushort)(sVar41 < sVar52) * sVar52 | (ushort)(sVar41 >= sVar52) * sVar41);
  auVar78._14_2_ =
       mtx->sharpen_[0xf] +
       ((ushort)(sVar43 < sVar53) * sVar53 | (ushort)(sVar43 >= sVar53) * sVar43);
  auVar84 = pmulhuw(auVar92,auVar58);
  sVar95 = auVar92._6_2_ * auVar58._6_2_;
  auVar30 = pmulhuw(auVar78,auVar72);
  sVar80 = auVar78._6_2_ * auVar72._6_2_;
  iVar22 = CONCAT22(auVar84._6_2_,sVar95);
  Var20 = CONCAT64(CONCAT42(iVar22,auVar84._4_2_),CONCAT22(auVar92._4_2_ * auVar58._4_2_,sVar95));
  auVar18._4_8_ = (long)((unkuint10)Var20 >> 0x10);
  auVar18._2_2_ = auVar84._2_2_;
  auVar18._0_2_ = auVar92._2_2_ * auVar58._2_2_;
  iVar87 = CONCAT22(auVar84._8_2_,auVar92._8_2_ * auVar58._8_2_);
  auVar89._0_8_ = CONCAT26(auVar84._10_2_,CONCAT24(auVar92._10_2_ * auVar58._10_2_,iVar87));
  auVar89._8_2_ = auVar92._12_2_ * auVar58._12_2_;
  auVar89._10_2_ = auVar84._12_2_;
  auVar93._12_2_ = auVar92._14_2_ * auVar58._14_2_;
  auVar93._0_12_ = auVar89;
  auVar93._14_2_ = auVar84._14_2_;
  iVar23 = CONCAT22(auVar30._6_2_,sVar80);
  Var21 = CONCAT64(CONCAT42(iVar23,auVar30._4_2_),CONCAT22(auVar78._4_2_ * auVar72._4_2_,sVar80));
  auVar19._4_8_ = (long)((unkuint10)Var21 >> 0x10);
  auVar19._2_2_ = auVar30._2_2_;
  auVar19._0_2_ = auVar78._2_2_ * auVar72._2_2_;
  iVar75 = CONCAT22(auVar30._8_2_,auVar78._8_2_ * auVar72._8_2_);
  auVar76._0_8_ = CONCAT26(auVar30._10_2_,CONCAT24(auVar78._10_2_ * auVar72._10_2_,iVar75));
  auVar76._8_2_ = auVar78._12_2_ * auVar72._12_2_;
  auVar76._10_2_ = auVar30._12_2_;
  auVar79._12_2_ = auVar78._14_2_ * auVar72._14_2_;
  auVar79._0_12_ = auVar76;
  auVar79._14_2_ = auVar30._14_2_;
  auVar57._0_4_ =
       (int)(mtx->bias_[0] + CONCAT22(auVar84._0_2_,auVar92._0_2_ * auVar58._0_2_)) >> 0x11;
  auVar57._4_4_ = (int)(mtx->bias_[1] + auVar18._0_4_) >> 0x11;
  auVar57._8_4_ = (int)(mtx->bias_[2] + (int)((unkuint10)Var20 >> 0x10)) >> 0x11;
  auVar57._12_4_ = (int)(mtx->bias_[3] + iVar22) >> 0x11;
  auVar96._0_4_ = (int)(mtx->bias_[4] + iVar87) >> 0x11;
  auVar96._4_4_ = (int)(mtx->bias_[5] + (int)((ulong)auVar89._0_8_ >> 0x20)) >> 0x11;
  auVar96._8_4_ = (int)(mtx->bias_[6] + auVar89._8_4_) >> 0x11;
  auVar96._12_4_ = (int)(mtx->bias_[7] + auVar93._12_4_) >> 0x11;
  auVar58 = packssdw(auVar57,auVar96);
  auVar71._0_4_ =
       (int)(mtx->bias_[8] + CONCAT22(auVar30._0_2_,auVar78._0_2_ * auVar72._0_2_)) >> 0x11;
  auVar71._4_4_ = (int)(mtx->bias_[9] + auVar19._0_4_) >> 0x11;
  auVar71._8_4_ = (int)(mtx->bias_[10] + (int)((unkuint10)Var21 >> 0x10)) >> 0x11;
  auVar71._12_4_ = (int)(mtx->bias_[0xb] + iVar23) >> 0x11;
  auVar85._0_4_ = (int)(mtx->bias_[0xc] + iVar75) >> 0x11;
  auVar85._4_4_ = (int)(mtx->bias_[0xd] + (int)((ulong)auVar76._0_8_ >> 0x20)) >> 0x11;
  auVar85._8_4_ = (int)(mtx->bias_[0xe] + auVar76._8_4_) >> 0x11;
  auVar85._12_4_ = (int)(mtx->bias_[0xf] + auVar79._12_4_) >> 0x11;
  auVar72 = packssdw(auVar71,auVar85);
  sVar80 = auVar58._0_2_;
  auVar59._0_2_ = (ushort)(sVar86 < sVar80) * sVar86 | (ushort)(sVar86 >= sVar80) * sVar80;
  sVar80 = auVar58._2_2_;
  auVar59._2_2_ = (ushort)(sVar94 < sVar80) * sVar94 | (ushort)(sVar94 >= sVar80) * sVar80;
  sVar80 = auVar58._4_2_;
  auVar59._4_2_ = (ushort)(sVar61 < sVar80) * sVar61 | (ushort)(sVar61 >= sVar80) * sVar80;
  sVar80 = auVar58._6_2_;
  auVar59._6_2_ = (ushort)(sVar62 < sVar80) * sVar62 | (ushort)(sVar62 >= sVar80) * sVar80;
  sVar80 = auVar58._8_2_;
  auVar59._8_2_ = (ushort)(sVar63 < sVar80) * sVar63 | (ushort)(sVar63 >= sVar80) * sVar80;
  sVar80 = auVar58._10_2_;
  auVar59._10_2_ = (ushort)(sVar64 < sVar80) * sVar64 | (ushort)(sVar64 >= sVar80) * sVar80;
  sVar80 = auVar58._12_2_;
  sVar95 = auVar58._14_2_;
  auVar59._12_2_ = (ushort)(sVar65 < sVar80) * sVar65 | (ushort)(sVar65 >= sVar80) * sVar80;
  auVar59._14_2_ = (ushort)(sVar66 < sVar95) * sVar66 | (ushort)(sVar66 >= sVar95) * sVar95;
  sVar80 = auVar72._0_2_;
  auVar73._0_2_ = (ushort)(sVar86 < sVar80) * sVar86 | (ushort)(sVar86 >= sVar80) * sVar80;
  sVar86 = auVar72._2_2_;
  auVar73._2_2_ = (ushort)(sVar94 < sVar86) * sVar94 | (ushort)(sVar94 >= sVar86) * sVar86;
  sVar86 = auVar72._4_2_;
  auVar73._4_2_ = (ushort)(sVar61 < sVar86) * sVar61 | (ushort)(sVar61 >= sVar86) * sVar86;
  sVar86 = auVar72._6_2_;
  auVar73._6_2_ = (ushort)(sVar62 < sVar86) * sVar62 | (ushort)(sVar62 >= sVar86) * sVar86;
  sVar86 = auVar72._8_2_;
  auVar73._8_2_ = (ushort)(sVar63 < sVar86) * sVar63 | (ushort)(sVar63 >= sVar86) * sVar86;
  sVar86 = auVar72._10_2_;
  auVar73._10_2_ = (ushort)(sVar64 < sVar86) * sVar64 | (ushort)(sVar64 >= sVar86) * sVar86;
  sVar86 = auVar72._12_2_;
  sVar94 = auVar72._14_2_;
  auVar73._12_2_ = (ushort)(sVar65 < sVar86) * sVar65 | (ushort)(sVar65 >= sVar86) * sVar86;
  auVar73._14_2_ = (ushort)(sVar66 < sVar94) * sVar66 | (ushort)(sVar66 >= sVar94) * sVar94;
  auVar59 = auVar59 ^ auVar24;
  auVar73 = auVar73 ^ auVar67;
  auVar60._0_2_ = auVar59._0_2_ - auVar24._0_2_;
  auVar60._2_2_ = auVar59._2_2_ - auVar24._2_2_;
  auVar60._4_2_ = auVar59._4_2_ - auVar24._4_2_;
  auVar60._6_2_ = auVar59._6_2_ - auVar24._6_2_;
  auVar60._8_2_ = auVar59._8_2_ - auVar24._8_2_;
  auVar60._10_2_ = auVar59._10_2_ - auVar24._10_2_;
  auVar60._12_2_ = auVar59._12_2_ - auVar24._12_2_;
  auVar60._14_2_ = auVar59._14_2_ - auVar24._14_2_;
  auVar74._0_2_ = auVar73._0_2_ - auVar67._0_2_;
  auVar74._2_2_ = auVar73._2_2_ - auVar67._2_2_;
  auVar74._4_2_ = auVar73._4_2_ - auVar67._4_2_;
  auVar74._6_2_ = auVar73._6_2_ - auVar67._6_2_;
  auVar74._8_2_ = auVar73._8_2_ - auVar67._8_2_;
  auVar74._10_2_ = auVar73._10_2_ - auVar67._10_2_;
  auVar74._12_2_ = auVar73._12_2_ - auVar67._12_2_;
  auVar74._14_2_ = auVar73._14_2_ - auVar67._14_2_;
  auVar84._0_2_ = mtx->q_[0] * auVar60._0_2_;
  auVar84._2_2_ = mtx->q_[1] * auVar60._2_2_;
  auVar84._4_2_ = mtx->q_[2] * auVar60._4_2_;
  auVar84._6_2_ = mtx->q_[3] * auVar60._6_2_;
  auVar84._8_2_ = mtx->q_[4] * auVar60._8_2_;
  auVar84._10_2_ = mtx->q_[5] * auVar60._10_2_;
  auVar84._12_2_ = mtx->q_[6] * auVar60._12_2_;
  auVar84._14_2_ = mtx->q_[7] * auVar60._14_2_;
  *(undefined1 (*) [16])(in + 0x10) = auVar84;
  in[0x18] = uVar8 * auVar74._0_2_;
  in[0x19] = uVar9 * auVar74._2_2_;
  in[0x1a] = uVar10 * auVar74._4_2_;
  in[0x1b] = uVar11 * auVar74._6_2_;
  in[0x1c] = uVar12 * auVar74._8_2_;
  in[0x1d] = uVar13 * auVar74._10_2_;
  in[0x1e] = uVar14 * auVar74._12_2_;
  in[0x1f] = uVar15 * auVar74._14_2_;
  auVar24 = pshufhw(auVar25,auVar60,0xc6);
  auVar58._0_4_ = auVar24._0_4_;
  auVar58._8_4_ = auVar24._8_4_;
  auVar58._4_4_ = auVar24._12_4_;
  auVar58._12_4_ = auVar24._4_4_;
  auVar24 = pshufhw(auVar58,auVar58,0x39);
  auVar67 = pshuflw(auVar84,auVar74,0xc6);
  auVar25._0_4_ = auVar67._0_4_;
  auVar25._12_4_ = auVar67._12_4_;
  auVar25._4_4_ = auVar67._8_4_;
  auVar25._8_4_ = auVar67._4_4_;
  auVar67 = pshuflw(auVar25,auVar25,0x39);
  *(undefined1 (*) [16])(out + 0x10) = auVar24;
  *(undefined1 (*) [16])(out + 0x18) = auVar67;
  auVar24 = packsswb(auVar24,auVar67);
  iVar1 = out[0x13];
  out[0x13] = out[0x1c];
  out[0x1c] = iVar1;
  auVar72[0] = -(auVar24[0] == '\0');
  auVar72[1] = -(auVar24[1] == '\0');
  auVar72[2] = -(auVar24[2] == '\0');
  auVar72[3] = -(auVar24[3] == '\0');
  auVar72[4] = -(auVar24[4] == '\0');
  auVar72[5] = -(auVar24[5] == '\0');
  auVar72[6] = -(auVar24[6] == '\0');
  auVar72[7] = -(auVar24[7] == '\0');
  auVar72[8] = -(auVar24[8] == '\0');
  auVar72[9] = -(auVar24[9] == '\0');
  auVar72[10] = -(auVar24[10] == '\0');
  auVar72[0xb] = -(auVar24[0xb] == '\0');
  auVar72[0xc] = -(auVar24[0xc] == '\0');
  auVar72[0xd] = -(auVar24[0xd] == '\0');
  auVar72[0xe] = -(auVar24[0xe] == '\0');
  auVar72[0xf] = -(auVar24[0xf] == '\0');
  return (uint)((ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar46[0xf] >> 7) << 0xf) != 0xffff) +
         (uint)((ushort)((ushort)(SUB161(auVar72 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar72[0xf] >> 7) << 0xf) != 0xffff) * 2;
}

Assistant:

static WEBP_INLINE int DoQuantizeBlock_SSE2(int16_t in[16], int16_t out[16],
                                            const uint16_t* const sharpen,
                                            const VP8Matrix* const mtx) {
  const __m128i max_coeff_2047 = _mm_set1_epi16(MAX_LEVEL);
  const __m128i zero = _mm_setzero_si128();
  __m128i coeff0, coeff8;
  __m128i out0, out8;
  __m128i packed_out;

  // Load all inputs.
  __m128i in0 = _mm_loadu_si128((__m128i*)&in[0]);
  __m128i in8 = _mm_loadu_si128((__m128i*)&in[8]);
  const __m128i iq0 = _mm_loadu_si128((const __m128i*)&mtx->iq_[0]);
  const __m128i iq8 = _mm_loadu_si128((const __m128i*)&mtx->iq_[8]);
  const __m128i q0 = _mm_loadu_si128((const __m128i*)&mtx->q_[0]);
  const __m128i q8 = _mm_loadu_si128((const __m128i*)&mtx->q_[8]);

  // extract sign(in)  (0x0000 if positive, 0xffff if negative)
  const __m128i sign0 = _mm_cmpgt_epi16(zero, in0);
  const __m128i sign8 = _mm_cmpgt_epi16(zero, in8);

  // coeff = abs(in) = (in ^ sign) - sign
  coeff0 = _mm_xor_si128(in0, sign0);
  coeff8 = _mm_xor_si128(in8, sign8);
  coeff0 = _mm_sub_epi16(coeff0, sign0);
  coeff8 = _mm_sub_epi16(coeff8, sign8);

  // coeff = abs(in) + sharpen
  if (sharpen != NULL) {
    const __m128i sharpen0 = _mm_loadu_si128((const __m128i*)&sharpen[0]);
    const __m128i sharpen8 = _mm_loadu_si128((const __m128i*)&sharpen[8]);
    coeff0 = _mm_add_epi16(coeff0, sharpen0);
    coeff8 = _mm_add_epi16(coeff8, sharpen8);
  }

  // out = (coeff * iQ + B) >> QFIX
  {
    // doing calculations with 32b precision (QFIX=17)
    // out = (coeff * iQ)
    const __m128i coeff_iQ0H = _mm_mulhi_epu16(coeff0, iq0);
    const __m128i coeff_iQ0L = _mm_mullo_epi16(coeff0, iq0);
    const __m128i coeff_iQ8H = _mm_mulhi_epu16(coeff8, iq8);
    const __m128i coeff_iQ8L = _mm_mullo_epi16(coeff8, iq8);
    __m128i out_00 = _mm_unpacklo_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_04 = _mm_unpackhi_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_08 = _mm_unpacklo_epi16(coeff_iQ8L, coeff_iQ8H);
    __m128i out_12 = _mm_unpackhi_epi16(coeff_iQ8L, coeff_iQ8H);
    // out = (coeff * iQ + B)
    const __m128i bias_00 = _mm_loadu_si128((const __m128i*)&mtx->bias_[0]);
    const __m128i bias_04 = _mm_loadu_si128((const __m128i*)&mtx->bias_[4]);
    const __m128i bias_08 = _mm_loadu_si128((const __m128i*)&mtx->bias_[8]);
    const __m128i bias_12 = _mm_loadu_si128((const __m128i*)&mtx->bias_[12]);
    out_00 = _mm_add_epi32(out_00, bias_00);
    out_04 = _mm_add_epi32(out_04, bias_04);
    out_08 = _mm_add_epi32(out_08, bias_08);
    out_12 = _mm_add_epi32(out_12, bias_12);
    // out = QUANTDIV(coeff, iQ, B, QFIX)
    out_00 = _mm_srai_epi32(out_00, QFIX);
    out_04 = _mm_srai_epi32(out_04, QFIX);
    out_08 = _mm_srai_epi32(out_08, QFIX);
    out_12 = _mm_srai_epi32(out_12, QFIX);

    // pack result as 16b
    out0 = _mm_packs_epi32(out_00, out_04);
    out8 = _mm_packs_epi32(out_08, out_12);

    // if (coeff > 2047) coeff = 2047
    out0 = _mm_min_epi16(out0, max_coeff_2047);
    out8 = _mm_min_epi16(out8, max_coeff_2047);
  }

  // get sign back (if (sign[j]) out_n = -out_n)
  out0 = _mm_xor_si128(out0, sign0);
  out8 = _mm_xor_si128(out8, sign8);
  out0 = _mm_sub_epi16(out0, sign0);
  out8 = _mm_sub_epi16(out8, sign8);

  // in = out * Q
  in0 = _mm_mullo_epi16(out0, q0);
  in8 = _mm_mullo_epi16(out8, q8);

  _mm_storeu_si128((__m128i*)&in[0], in0);
  _mm_storeu_si128((__m128i*)&in[8], in8);

  // zigzag the output before storing it.
  //
  // The zigzag pattern can almost be reproduced with a small sequence of
  // shuffles. After it, we only need to swap the 7th (ending up in third
  // position instead of twelfth) and 8th values.
  {
    __m128i outZ0, outZ8;
    outZ0 = _mm_shufflehi_epi16(out0,  _MM_SHUFFLE(2, 1, 3, 0));
    outZ0 = _mm_shuffle_epi32  (outZ0, _MM_SHUFFLE(3, 1, 2, 0));
    outZ0 = _mm_shufflehi_epi16(outZ0, _MM_SHUFFLE(3, 1, 0, 2));
    outZ8 = _mm_shufflelo_epi16(out8,  _MM_SHUFFLE(3, 0, 2, 1));
    outZ8 = _mm_shuffle_epi32  (outZ8, _MM_SHUFFLE(3, 1, 2, 0));
    outZ8 = _mm_shufflelo_epi16(outZ8, _MM_SHUFFLE(1, 3, 2, 0));
    _mm_storeu_si128((__m128i*)&out[0], outZ0);
    _mm_storeu_si128((__m128i*)&out[8], outZ8);
    packed_out = _mm_packs_epi16(outZ0, outZ8);
  }
  {
    const int16_t outZ_12 = out[12];
    const int16_t outZ_3 = out[3];
    out[3] = outZ_12;
    out[12] = outZ_3;
  }

  // detect if all 'out' values are zeroes or not
  return (_mm_movemask_epi8(_mm_cmpeq_epi8(packed_out, zero)) != 0xffff);
}